

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O3

void __thiscall avro::Validator::setCount(Validator *this,int64_t count)

{
  undefined8 *puVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->waitingForCount_ == false) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Not expecting count","");
    std::runtime_error::runtime_error((runtime_error *)(puVar1 + 1),(string *)local_40);
    *puVar1 = 0x1cc910;
    puVar1[1] = 0x1cc940;
    __cxa_throw(puVar1,&Exception::typeinfo,Exception::~Exception);
  }
  if (-1 < this->count_) {
    this->count_ = count;
    doAdvance(this);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Count cannot be negative","");
  std::runtime_error::runtime_error((runtime_error *)(puVar1 + 1),(string *)local_40);
  *puVar1 = 0x1cc910;
  puVar1[1] = 0x1cc940;
  __cxa_throw(puVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void
Validator::setCount(int64_t count) 
{
    if(!waitingForCount_) {
        throw Exception("Not expecting count");
    }
    else if(count_ < 0) {
        throw Exception("Count cannot be negative");
    }
    count_ = count;

    doAdvance();
}